

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O1

int GetCharConstAsString<unsigned_char>(char **p,uchar *e,int *ei,int max_ei,int add)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  aint val;
  aint local_3c;
  char *local_38;
  
  local_38 = *p;
  if ((*local_38 != '\'') && (*local_38 != '\"')) {
    return 0;
  }
  *p = local_38 + 1;
  cVar1 = *local_38;
  while (*ei < max_ei) {
    if (cVar1 == '\"') {
      iVar3 = GetCharConstInDoubleQuotes(p,&local_3c);
    }
    else {
      iVar3 = GetCharConstInApostrophes(p,&local_3c);
    }
    if (iVar3 == 0) break;
    iVar3 = *ei;
    *ei = iVar3 + 1;
    e[iVar3] = (char)local_3c + (char)add;
  }
  pcVar2 = *p;
  if ((uint)(cVar1 != '\"') * 5 + 0x22 == (int)*pcVar2) {
    *p = pcVar2 + 1;
    if (pcVar2[1] == 'C') {
      *p = pcVar2 + 2;
      if ((long)*ei == 0) goto LAB_00125c68;
      e[(long)*ei + -1] = e[(long)*ei + -1] | 0x80;
    }
    else if (pcVar2[1] == 'Z') {
      iVar3 = *ei;
      if (max_ei <= iVar3) {
        return -2;
      }
      *p = pcVar2 + 2;
      *ei = iVar3 + 1;
      e[iVar3] = '\0';
    }
    iVar3 = (cVar1 == '\"') + 1;
  }
  else {
    if (*pcVar2 != '\0') {
      return -2;
    }
    Error("Syntax error",local_38,SUPPRESS);
LAB_00125c68:
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int GetCharConstAsString(char* & p, strT e[], int & ei, int max_ei, int add) {
	if ('"' != *p && '\'' != *p) return 0;
	const char* const elementP = p;
	const bool quotes = ('"' == *p++);
	aint val;
	while (ei < max_ei && (quotes ? GetCharConstInDoubleQuotes(p, val) : GetCharConstInApostrophes(p, val))) {
		e[ei++] = (val + add) & 255;
	}
	if ((quotes ? '"' : '\'') != *p) {	// too many/invalid arguments or zero-terminator can lead to this
		if (*p) return -2;				// too many arguments
		Error("Syntax error", elementP, SUPPRESS);	// zero-terminator
		return -1;
	}
	++p;
	if ('Z' == *p) {
		if (max_ei <= ei) return -2;	// no space for zero byte (keep p pointing at Z to report error)
		++p;
		e[ei++] = 0;
	} else if ('C' == *p) {
		++p;
		if (0 == ei) return -1;			// empty string can't have last char patched
		e[ei - 1] |= 0x80;
	}
	return 1 + quotes;
}